

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O3

void __thiscall
EnvironmentMap::Reset
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,char *filename)

{
  float *__ptr;
  char *unaff_RBX;
  vector<double,_std::allocator<double>_> weights;
  HdrImg img;
  vector<double,_std::allocator<double>_> local_50;
  HdrImg local_38;
  
  local_38 = load_hdr_image(unaff_RBX);
  __ptr = local_38.m_data;
  if (__ptr != (float *)0x0) {
    weigh_hdr_image(&local_50,&local_38);
    create_images(this,command_pool,&local_38,&local_50);
    free(__ptr);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              ((this->m_descriptor_set).
               super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_sampler,&this->m_hdr_image_view,0,0);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              ((this->m_descriptor_set).
               super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_sampler,&this->m_alias_table_image_view,1,0);
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EnvironmentMap::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, const char *filename) {
	HdrImg img = load_hdr_image(filename);
	if (!img.m_data)
		return;

	std::vector<double> weights = weigh_hdr_image(&img);
	create_images(command_pool, img, &weights);

	free(img.m_data); // release hdr image data

	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_hdr_image_view, 0);
	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_alias_table_image_view, 1);
}